

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

void __thiscall MultiAgentDecisionProcessDiscrete::GetOGet(MultiAgentDecisionProcessDiscrete *this)

{
  MultiAgentDecisionProcessDiscrete *in_stack_00000038;
  
  GetOGet(in_stack_00000038);
  return;
}

Assistant:

OGet* MultiAgentDecisionProcessDiscrete::GetOGet() const
{ 
    if(!_m_eventObservability) //default
    {
        if(_m_sparse)
            return new OGet_ObservationModelMappingSparse(
                    ((ObservationModelMappingSparse*)_m_p_oModel)  ); 
        else
            return new OGet_ObservationModelMapping(
                    ((ObservationModelMapping*)_m_p_oModel)  );
    }
    else
    {
        if(_m_sparse)
            return new OGet_EventObservationModelMappingSparse(
                    ((EventObservationModelMappingSparse*)_m_p_oModel)  ); 
        else
            return new OGet_EventObservationModelMapping(
                    ((EventObservationModelMapping*)_m_p_oModel)  );
    }    
}